

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O1

long __thiscall dlib::drawable::height(drawable *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  auto_mutex M;
  auto_mutex local_40;
  
  local_40.r = this->m;
  local_40.m = (mutex *)0x0;
  local_40.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_40.r,1);
  lVar1 = (this->rect).l;
  lVar2 = (this->rect).t;
  lVar3 = (this->rect).b;
  lVar4 = (this->rect).r;
  auto_mutex::unlock(&local_40);
  lVar5 = (lVar3 - lVar2) + 1;
  if (lVar4 < lVar1) {
    lVar5 = 0;
  }
  if (lVar3 < lVar2) {
    lVar5 = 0;
  }
  return lVar5;
}

Assistant:

long height (
        ) const 
        { 
            auto_mutex M(m); 
            return rect.height(); 
        }